

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::NotImplementedException::NotImplementedException<unsigned_long,unsigned_int>
          (NotImplementedException *this,string *msg,unsigned_long params,uint params_1)

{
  undefined4 in_register_0000000c;
  uint in_R8D;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,unsigned_int>
            (&local_30,(Exception *)msg,(string *)params,CONCAT44(in_register_0000000c,params_1),
             in_R8D);
  NotImplementedException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}